

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O2

ImVector_ImFontGlyph * ImVector_ImFontGlyph_ImVector_ImFontGlyphVector(ImVector_ImFontGlyph *src)

{
  ImVector<ImFontGlyph> *this;
  
  this = (ImVector<ImFontGlyph> *)ImGui::MemAlloc(0x10);
  ImVector<ImFontGlyph>::ImVector(this,src);
  return this;
}

Assistant:

CIMGUI_API ImVector_ImFontGlyph* ImVector_ImFontGlyph_ImVector_ImFontGlyphVector(const ImVector_ImFontGlyph src)
{
    return IM_NEW(ImVector_ImFontGlyph)(src);
}